

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_CCtx_loadDictionary_byReference(ZSTD_CCtx *cctx,void *dict,size_t dictSize)

{
  size_t sVar1;
  size_t dictSize_local;
  void *dict_local;
  ZSTD_CCtx *cctx_local;
  
  sVar1 = ZSTD_CCtx_loadDictionary_advanced(cctx,dict,dictSize,ZSTD_dlm_byRef,ZSTD_dct_auto);
  return sVar1;
}

Assistant:

size_t ZSTD_CCtx_loadDictionary_byReference(
      ZSTD_CCtx* cctx, const void* dict, size_t dictSize)
{
    return ZSTD_CCtx_loadDictionary_advanced(
            cctx, dict, dictSize, ZSTD_dlm_byRef, ZSTD_dct_auto);
}